

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,string *text)

{
  size_type __n;
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  Buffer *local_178;
  code *local_170;
  code *local_138;
  Buffer *buf;
  Buffer *__end1;
  Buffer *__begin1;
  Buffer (*__range1) [2];
  size_t other_idx;
  size_t current_idx;
  size_t eol;
  size_t pos;
  allocator<char> local_a9;
  string local_a8 [8];
  string padding;
  Buffer buffers [2];
  uint HANDLERS_SIZE;
  uint PREFORMATTED_IDX;
  string *text_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    buffers[1]._44_4_ = 1;
    buffers[1]._40_4_ = 2;
    std::__cxx11::string::string((string *)(padding.field_2._M_local_buf + 8));
    buffers[0].collected.field_2._8_8_ = PrintParagraph;
    buffers[0].printer = 0;
    std::__cxx11::string::string((string *)&buffers[0].field_0x28);
    buffers[1].collected.field_2._8_8_ = PrintPreformatted;
    buffers[1].printer = 0;
    __n = this->TextIndent;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a8,__n,' ',&local_a9);
    std::allocator<char>::~allocator(&local_a9);
    eol = 0;
    while (uVar1 = std::__cxx11::string::size(), eol < uVar1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)text);
      uVar1 = (ulong)(*pcVar2 == ' ');
      uVar3 = uVar1 ^ 1;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          __assert_fail("buffers[current_idx].collected.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmDocumentationFormatter.cxx"
                        ,0x46,
                        "void cmDocumentationFormatter::PrintFormatted(std::ostream &, const std::string &) const"
                       );
        }
        local_138 = *(code **)((long)&buffers[uVar3].collected.field_2 + 8);
        plVar6 = (long *)((long)&this->TextWidth + buffers[uVar3].printer);
        if (((ulong)local_138 & 1) != 0) {
          local_138 = *(code **)(local_138 + *plVar6 + -1);
        }
        (*local_138)(plVar6,os,&buffers[uVar3 - 1].field_0x28);
        std::__cxx11::string::clear();
      }
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) && (uVar1 != 1)) {
        std::__cxx11::string::operator+=((string *)&buffers[uVar1 - 1].field_0x28,'\n');
      }
      lVar5 = std::__cxx11::string::find((char)text,10);
      if (uVar1 == 1) {
        std::__cxx11::string::append((string *)&buffers[0].field_0x28);
      }
      if (lVar5 == -1) {
        current_idx = 0xffffffffffffffff;
      }
      else {
        current_idx = lVar5 + 1;
      }
      std::__cxx11::string::append((string *)&buffers[uVar1 - 1].field_0x28,(ulong)text,eol);
      eol = current_idx;
    }
    for (__end1 = (Buffer *)((long)&padding.field_2 + 8); __end1 != (Buffer *)&buffers[1].field_0x28
        ; __end1 = __end1 + 1) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        local_170 = (code *)__end1->printer;
        plVar6 = (long *)((long)&this->TextWidth + *(long *)&__end1->field_0x28);
        if (((ulong)local_170 & 1) != 0) {
          local_170 = *(code **)(local_170 + *plVar6 + -1);
        }
        (*local_170)(plVar6,os,__end1);
      }
    }
    std::__cxx11::string::~string(local_a8);
    local_178 = (Buffer *)&buffers[1].field_0x28;
    do {
      local_178 = local_178 + -1;
      PrintFormatted::Buffer::~Buffer(local_178);
    } while (local_178 != (Buffer *)((long)&padding.field_2 + 8));
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              std::string const& text) const
{
  if (text.empty()) {
    return;
  }

  struct Buffer
  {
    // clang-format off
    using PrinterFn = void (cmDocumentationFormatter::*)(
        std::ostream&, std::string const&
      ) const;
    // clang-format on
    std::string collected;
    const PrinterFn printer;
  };
  // const auto NORMAL_IDX = 0u;
  const auto PREFORMATTED_IDX = 1u;
  const auto HANDLERS_SIZE = 2u;
  Buffer buffers[HANDLERS_SIZE] = {
    { {}, &cmDocumentationFormatter::PrintParagraph },
    { {}, &cmDocumentationFormatter::PrintPreformatted }
  };

  const auto padding = std::string(this->TextIndent, ' ');

  for (std::size_t pos = 0u, eol = 0u; pos < text.size(); pos = eol) {
    const auto current_idx = std::size_t(text[pos] == ' ');
    // size_t(!bool(current_idx))
    const auto other_idx = current_idx ^ 1u;

    // Flush the other buffer if anything has been collected
    if (!buffers[other_idx].collected.empty()) {
      // NOTE Whatever the other index is, the current buffered
      // string expected to be empty.
      assert(buffers[current_idx].collected.empty());

      (this->*buffers[other_idx].printer)(os, buffers[other_idx].collected);
      buffers[other_idx].collected.clear();
    }

    // ATTENTION The previous implementation had called `PrintParagraph()`
    // **for every processed (char by char) input line**.
    // The method unconditionally append the `\n' character after the
    // printed text. To keep the backward-compatible behavior it's needed to
    // add the '\n' character to the previously collected line...
    if (!buffers[current_idx].collected.empty() &&
        current_idx != PREFORMATTED_IDX) {
      buffers[current_idx].collected += '\n';
    }

    // Lookup EOL
    eol = text.find('\n', pos);
    if (current_idx == PREFORMATTED_IDX) {
      buffers[current_idx].collected.append(padding);
    }
    buffers[current_idx].collected.append(
      text, pos, eol == std::string::npos ? eol : ++eol - pos);
  }

  for (auto& buf : buffers) {
    if (!buf.collected.empty()) {
      (this->*buf.printer)(os, buf.collected);
    }
  }
}